

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O3

void __thiscall
QComboBoxPrivateContainer::setItemView(QComboBoxPrivateContainer *this,QAbstractItemView *itemView)

{
  long lVar1;
  QAbstractItemView *pQVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  QWidget *pQVar6;
  QObject *pQVar7;
  QBoxLayout *this_00;
  QStyle *pQVar8;
  QScrollBar *pQVar9;
  undefined4 *puVar10;
  long in_FS_OFFSET;
  QObject local_100 [8];
  QObject local_f8 [8];
  code *local_f0;
  ImplFn local_e8;
  QObject local_e0 [8];
  code *local_d8;
  undefined8 local_d0;
  QStyleOptionComboBox opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((QObject *)this->view != (QObject *)0x0) {
    QObject::removeEventFilter((QObject *)this->view);
    pQVar6 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this->view);
    QObject::removeEventFilter(&pQVar6->super_QObject);
    pQVar7 = (QObject *)QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this->view);
    opt.super_QStyleOptionComplex.super_QStyleOption._0_8_ = QAbstractSlider::valueChanged;
    opt.super_QStyleOptionComplex.super_QStyleOption.state.
    super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)0x0;
    opt.super_QStyleOptionComplex.super_QStyleOption.direction = LeftToRight;
    local_d8 = updateScrollers;
    local_d0 = 0;
    QObject::disconnectImpl
              (pQVar7,(void **)&opt,(QObject *)this,&local_d8,&QAbstractSlider::staticMetaObject);
    pQVar7 = (QObject *)QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this->view);
    opt.super_QStyleOptionComplex.super_QStyleOption._0_8_ = QAbstractSlider::rangeChanged;
    opt.super_QStyleOptionComplex.super_QStyleOption.state.
    super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)0x0;
    opt.super_QStyleOptionComplex.super_QStyleOption.direction = LeftToRight;
    local_d8 = updateScrollers;
    local_d0 = 0;
    QObject::disconnectImpl
              (pQVar7,(void **)&opt,(QObject *)this,&local_d8,&QAbstractSlider::staticMetaObject);
    opt.super_QStyleOptionComplex.super_QStyleOption._0_8_ = QObject::destroyed;
    opt.super_QStyleOptionComplex.super_QStyleOption.state.
    super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)0x0;
    opt.super_QStyleOptionComplex.super_QStyleOption.direction = LeftToRight;
    local_d8 = viewDestroyed;
    local_d0 = 0;
    QObject::disconnectImpl
              ((QObject *)this->view,(void **)&opt,(QObject *)this,&local_d8,
               (QMetaObject *)&QObject::staticMetaObject);
    bVar3 = QWidget::isAncestorOf((QWidget *)this,(QWidget *)this->view);
    if ((bVar3) && (this->view != (QAbstractItemView *)0x0)) {
      (**(code **)(*(long *)&(this->view->super_QAbstractScrollArea).super_QFrame.super_QWidget +
                  0x20))();
    }
  }
  this->view = itemView;
  QWidget::setParent((QWidget *)itemView,(QWidget *)this);
  QWidget::setAttribute((QWidget *)this->view,WA_MacShowFocusRect,false);
  QWidget::layout((QWidget *)this);
  this_00 = (QBoxLayout *)QMetaObject::cast((QObject *)&QBoxLayout::staticMetaObject);
  QBoxLayout::insertWidget
            (this_00,(uint)(this->top != (QComboBoxPrivateScroller *)0x0) * 2,(QWidget *)this->view,
             0,(Alignment)0x0);
  QWidget::setSizePolicy((QWidget *)this->view,(QSizePolicy)0xdd0000);
  QObject::installEventFilter((QObject *)this->view);
  pQVar6 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this->view);
  QObject::installEventFilter(&pQVar6->super_QObject);
  QAbstractScrollArea::setHorizontalScrollBarPolicy
            ((QAbstractScrollArea *)this->view,ScrollBarAlwaysOff);
  memset(&opt,0xaa,0x90);
  comboStyleOption(&opt,this);
  pQVar8 = QWidget::style(&this->combo->super_QWidget);
  iVar4 = (**(code **)(*(long *)pQVar8 + 0xf0))(pQVar8,0x19,&opt,this->combo,0);
  if (iVar4 != 0) {
    QAbstractScrollArea::setVerticalScrollBarPolicy
              ((QAbstractScrollArea *)this->view,ScrollBarAlwaysOff);
  }
  pQVar8 = QWidget::style(&this->combo->super_QWidget);
  iVar5 = (**(code **)(*(long *)pQVar8 + 0xf0))(pQVar8,0x13,&opt,this->combo,0);
  if (iVar5 != 0 || iVar4 != 0) {
    QWidget::setAttribute((QWidget *)this->view,WA_MouseTracking,true);
  }
  QAbstractItemView::setSelectionMode((QAbstractItemView *)this->view,SingleSelection);
  QFrame::setFrameStyle((QFrame *)this->view,0);
  QFrame::setLineWidth((QFrame *)this->view,0);
  QAbstractItemView::setEditTriggers((QAbstractItemView *)this->view,(EditTriggers)0x0);
  pQVar9 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this->view);
  local_f0 = updateScrollers;
  local_e8 = (ImplFn)0x0;
  local_d8 = QAbstractSlider::valueChanged;
  local_d0 = 0;
  puVar10 = (undefined4 *)operator_new(0x20);
  *puVar10 = 1;
  *(code **)(puVar10 + 2) =
       QtPrivate::QCallableObject<void_(QComboBoxPrivateContainer::*)(),_QtPrivate::List<>,_void>::
       impl;
  *(code **)(puVar10 + 4) = updateScrollers;
  *(undefined8 *)(puVar10 + 6) = 0;
  QObject::connectImpl
            (local_e0,(void **)pQVar9,(QObject *)&local_d8,(void **)this,
             (QSlotObjectBase *)&local_f0,(ConnectionType)puVar10,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_e0);
  pQVar9 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this->view);
  local_f0 = updateScrollers;
  local_e8 = (ImplFn)0x0;
  local_d8 = QAbstractSlider::rangeChanged;
  local_d0 = 0;
  puVar10 = (undefined4 *)operator_new(0x20);
  *puVar10 = 1;
  *(code **)(puVar10 + 2) =
       QtPrivate::QCallableObject<void_(QComboBoxPrivateContainer::*)(),_QtPrivate::List<>,_void>::
       impl;
  *(code **)(puVar10 + 4) = updateScrollers;
  *(undefined8 *)(puVar10 + 6) = 0;
  QObject::connectImpl
            (local_f8,(void **)pQVar9,(QObject *)&local_d8,(void **)this,
             (QSlotObjectBase *)&local_f0,(ConnectionType)puVar10,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_f8);
  pQVar2 = this->view;
  local_f0 = viewDestroyed;
  local_e8 = (ImplFn)0x0;
  local_d8 = QObject::destroyed;
  local_d0 = 0;
  puVar10 = (undefined4 *)operator_new(0x20);
  *puVar10 = 1;
  *(code **)(puVar10 + 2) =
       QtPrivate::QCallableObject<void_(QComboBoxPrivateContainer::*)(),_QtPrivate::List<>,_void>::
       impl;
  *(code **)(puVar10 + 4) = viewDestroyed;
  *(undefined8 *)(puVar10 + 6) = 0;
  QObject::connectImpl
            (local_100,(void **)pQVar2,(QObject *)&local_d8,(void **)this,
             (QSlotObjectBase *)&local_f0,(ConnectionType)puVar10,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_100);
  QIcon::~QIcon(&opt.currentIcon);
  if (opt.currentText.d.d != (Data *)0x0) {
    LOCK();
    ((opt.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((opt.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((opt.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(opt.currentText.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStyleOption::~QStyleOption((QStyleOption *)&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivateContainer::setItemView(QAbstractItemView *itemView)
{
    Q_ASSERT(itemView);

    // clean up old one
    if (view) {
        view->removeEventFilter(this);
        view->viewport()->removeEventFilter(this);
#if QT_CONFIG(scrollbar)
        disconnect(view->verticalScrollBar(), &QScrollBar::valueChanged,
                   this, &QComboBoxPrivateContainer::updateScrollers);
        disconnect(view->verticalScrollBar(), &QScrollBar::rangeChanged,
                   this, &QComboBoxPrivateContainer::updateScrollers);
#endif
        disconnect(view, &QAbstractItemView::destroyed,
                   this, &QComboBoxPrivateContainer::viewDestroyed);

        if (isAncestorOf(view))
            delete view;
        view = nullptr;
    }

    // setup the item view
    view = itemView;
    view->setParent(this);
    view->setAttribute(Qt::WA_MacShowFocusRect, false);
    qobject_cast<QBoxLayout*>(layout())->insertWidget(top ? 2 : 0, view);
    view->setSizePolicy(QSizePolicy::Ignored, QSizePolicy::Ignored);
    view->installEventFilter(this);
    view->viewport()->installEventFilter(this);
    view->setHorizontalScrollBarPolicy(Qt::ScrollBarAlwaysOff);
    QStyleOptionComboBox opt = comboStyleOption();
    const bool usePopup = combo->style()->styleHint(QStyle::SH_ComboBox_Popup, &opt, combo);
#if QT_CONFIG(scrollbar)
    if (usePopup)
        view->setVerticalScrollBarPolicy(Qt::ScrollBarAlwaysOff);
#endif
    if (combo->style()->styleHint(QStyle::SH_ComboBox_ListMouseTracking, &opt, combo) ||
        usePopup) {
        view->setMouseTracking(true);
    }
    view->setSelectionMode(QAbstractItemView::SingleSelection);
    view->setFrameStyle(QFrame::NoFrame);
    view->setLineWidth(0);
    view->setEditTriggers(QAbstractItemView::NoEditTriggers);
#if QT_CONFIG(scrollbar)
    connect(view->verticalScrollBar(), &QScrollBar::valueChanged,
            this, &QComboBoxPrivateContainer::updateScrollers);
    connect(view->verticalScrollBar(), &QScrollBar::rangeChanged,
            this, &QComboBoxPrivateContainer::updateScrollers);
#endif
    connect(view, &QAbstractItemView::destroyed,
            this, &QComboBoxPrivateContainer::viewDestroyed);
}